

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O0

void __thiscall TCLAP::StdOutput::_shortUsage(StdOutput *this,CmdLineInterface *_cmd,ostream *os)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  XorHandler *this_01;
  XorHandler *pXVar4;
  reference ppAVar5;
  undefined1 *puVar6;
  reference ppAVar7;
  long *in_RSI;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  *in_RDI;
  int secondLineOffset;
  ArgListIterator it_1;
  ArgVectorIterator it;
  int i;
  string s;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  xorList;
  XorHandler xorHandler;
  string progName;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> argList;
  XorHandler *in_stack_fffffffffffffdd8;
  XorHandler *in_stack_fffffffffffffde0;
  Arg *pAVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  char *__lhs;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  char *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  Arg *in_stack_fffffffffffffe10;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *in_stack_fffffffffffffe18;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *in_stack_fffffffffffffe20;
  _Self in_stack_fffffffffffffe48;
  string *in_stack_fffffffffffffe50;
  ostream *in_stack_fffffffffffffe58;
  StdOutput *in_stack_fffffffffffffe60;
  string local_188 [32];
  string local_168 [32];
  _Self local_148;
  _Self local_140;
  Arg **local_138;
  undefined1 local_129 [33];
  string local_108 [32];
  string local_e8 [32];
  Arg **local_c8;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_c0;
  uint local_b4;
  string local_b0 [32];
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  local_90;
  XorHandler local_78;
  string local_50 [64];
  long *local_10;
  
  local_10 = in_RSI;
  (**(code **)(*in_RSI + 0x58))();
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::list
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  psVar3 = (string *)(**(code **)(*local_10 + 0x50))();
  std::__cxx11::string::string(local_50,psVar3);
  __x = (vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
         *)(**(code **)(*local_10 + 0x60))();
  XorHandler::XorHandler(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            XorHandler::getXorList(&local_78);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::vector(in_RDI,__x);
  std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  local_b4 = 0;
  while( true ) {
    this_01 = (XorHandler *)(ulong)local_b4;
    pXVar4 = (XorHandler *)
             std::
             vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
             ::size(&local_90);
    if (pXVar4 <= this_01) break;
    std::__cxx11::string::operator+=(local_b0," {");
    std::
    vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
    ::operator[](&local_90,(long)(int)local_b4);
    local_c0._M_current =
         (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin
                           ((vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)
                            in_stack_fffffffffffffdd8);
    while( true ) {
      std::
      vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
      ::operator[](&local_90,(long)(int)local_b4);
      local_c8 = (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end
                                   ((vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)
                                    in_stack_fffffffffffffdd8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                          *)in_stack_fffffffffffffde0,
                         (__normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                          *)in_stack_fffffffffffffdd8);
      if (!bVar1) break;
      ppAVar5 = __gnu_cxx::
                __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                ::operator*(&local_c0);
      pAVar8 = *ppAVar5;
      in_stack_fffffffffffffe10 = (Arg *)local_129;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)this_01,(allocator<char> *)in_stack_fffffffffffffe10);
      (*pAVar8->_vptr_Arg[8])(local_108,pAVar8,local_129 + 1);
      std::operator+(in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
      std::__cxx11::string::operator+=(local_b0,local_e8);
      std::__cxx11::string::~string(local_e8);
      std::__cxx11::string::~string(local_108);
      std::__cxx11::string::~string((string *)(local_129 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_129);
      local_138 = (Arg **)__gnu_cxx::
                          __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                          ::operator++((__normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                                        *)in_stack_fffffffffffffde8,
                                       (int)((ulong)in_stack_fffffffffffffde0 >> 0x20));
    }
    std::__cxx11::string::length();
    puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_b0);
    *puVar6 = 0x7d;
    local_b4 = local_b4 + 1;
  }
  local_140._M_node =
       (_List_node_base *)
       std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin
                 ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)in_stack_fffffffffffffdd8);
  while( true ) {
    local_148._M_node =
         (_List_node_base *)
         std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end
                   ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)in_stack_fffffffffffffdd8);
    bVar1 = std::operator!=(&local_140,&local_148);
    if (!bVar1) break;
    std::_List_iterator<TCLAP::Arg_*>::operator*((_List_iterator<TCLAP::Arg_*> *)0x13a7fd);
    in_stack_fffffffffffffdf7 = XorHandler::contains(this_01,in_stack_fffffffffffffe10);
    if (!(bool)in_stack_fffffffffffffdf7) {
      ppAVar7 = std::_List_iterator<TCLAP::Arg_*>::operator*
                          ((_List_iterator<TCLAP::Arg_*> *)0x13a82e);
      pAVar8 = *ppAVar7;
      __lhs = &stack0xfffffffffffffe57;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)this_01,(allocator<char> *)in_stack_fffffffffffffe10);
      (*pAVar8->_vptr_Arg[8])(local_188,pAVar8,&stack0xfffffffffffffe58);
      std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pAVar8);
      std::__cxx11::string::operator+=(local_b0,local_168);
      std::__cxx11::string::~string(local_168);
      std::__cxx11::string::~string(local_188);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe58);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe57);
    }
    in_stack_fffffffffffffe48 = std::_List_iterator<TCLAP::Arg_*>::operator++(&local_140,0);
  }
  iVar2 = std::__cxx11::string::length();
  iVar2 = iVar2 + 2;
  if (0x25 < iVar2) {
    iVar2 = 0x25;
  }
  spacePrint(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
             (int)((ulong)in_stack_fffffffffffffe48._M_node >> 0x20),
             (int)in_stack_fffffffffffffe48._M_node,iVar2);
  std::__cxx11::string::~string(local_b0);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::~vector((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
  XorHandler::~XorHandler((XorHandler *)0x13aa08);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::~list
            ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)0x13aa22);
  return;
}

Assistant:

inline void 
StdOutput::_shortUsage( CmdLineInterface& _cmd, 
						std::ostream& os ) const
{
	std::list<Arg*> argList = _cmd.getArgList();
	std::string progName = _cmd.getProgramName();
	XorHandler xorHandler = _cmd.getXorHandler();
	std::vector< std::vector<Arg*> > xorList = xorHandler.getXorList();

	std::string s = progName + " ";

	// first the xor
	for ( int i = 0; static_cast<unsigned int>(i) < xorList.size(); i++ )
		{
			s += " {";
			for ( ArgVectorIterator it = xorList[i].begin(); 
				  it != xorList[i].end(); it++ )
				s += (*it)->shortID() + "|";

			s[s.length()-1] = '}';
		}

	// then the rest
	for (ArgListIterator it = argList.begin(); it != argList.end(); it++)
		if ( !xorHandler.contains( (*it) ) )
			s += " " + (*it)->shortID();

	// if the program name is too long, then adjust the second line offset 
	int secondLineOffset = static_cast<int>(progName.length()) + 2;
	if ( secondLineOffset > 75/2 )
		secondLineOffset = static_cast<int>(75/2);

	spacePrint( os, s, 75, 3, secondLineOffset );
}